

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png_io.cc
# Opt level: O3

void __thiscall
gimage::PNGImageIO::load
          (PNGImageIO *this,ImageU16 *image,char *name,int ds,long x,long y,long w,long h)

{
  int *piVar1;
  long lVar2;
  unsigned_short ***pppuVar3;
  size_t __n;
  byte bVar4;
  byte bVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  FILE *__stream;
  __jmp_buf_tag *__env;
  void *pvVar9;
  size_type *psVar10;
  IOException *pIVar11;
  long *plVar12;
  long lVar13;
  void *pvVar14;
  ushort uVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  ulong d;
  int iVar22;
  ulong uVar23;
  png_infop end;
  long local_190;
  long local_188;
  int local_17c;
  ulong local_178;
  allocator local_169;
  string local_168;
  long local_148;
  ulong local_140;
  long local_138;
  long local_130;
  ulong local_128;
  ulong local_120;
  void *local_118;
  uint local_110;
  uint local_10c;
  int local_108;
  uint local_104;
  long local_100;
  ulong local_f8;
  void *local_f0;
  void *local_e8;
  void *local_e0;
  size_t local_d8;
  void *local_d0;
  void *local_c8;
  long local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  long local_78;
  long local_70;
  void *local_68;
  long local_60;
  void *local_58;
  long local_50;
  ulong local_48;
  ImageU16 *local_40;
  FILE *local_38;
  
  local_138 = x;
  local_130 = y;
  iVar6 = (*(this->super_BasicImageIO)._vptr_BasicImageIO[3])(this,name,1);
  if ((char)iVar6 == '\0') {
    pIVar11 = (IOException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&local_b8,name,(allocator *)&local_190);
    std::operator+(&local_98,"Can only load PNG image (",&local_b8);
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_98);
    local_168._M_dataplus._M_p = (pointer)*plVar12;
    psVar10 = (size_type *)(plVar12 + 2);
    if ((size_type *)local_168._M_dataplus._M_p == psVar10) {
      local_168.field_2._M_allocated_capacity = *psVar10;
      local_168.field_2._8_8_ = plVar12[3];
      local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
    }
    else {
      local_168.field_2._M_allocated_capacity = *psVar10;
    }
    local_168._M_string_length = plVar12[1];
    *plVar12 = (long)psVar10;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    gutil::IOException::IOException(pIVar11,&local_168);
    __cxa_throw(pIVar11,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  __stream = fopen(name,"rb");
  if (__stream == (FILE *)0x0) {
    pIVar11 = (IOException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&local_b8,name,(allocator *)&local_190);
    std::operator+(&local_98,"Cannot open file (",&local_b8);
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_98);
    local_168._M_dataplus._M_p = (pointer)*plVar12;
    psVar10 = (size_type *)(plVar12 + 2);
    if ((size_type *)local_168._M_dataplus._M_p == psVar10) {
      local_168.field_2._M_allocated_capacity = *psVar10;
      local_168.field_2._8_8_ = plVar12[3];
      local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
    }
    else {
      local_168.field_2._M_allocated_capacity = *psVar10;
    }
    local_168._M_string_length = plVar12[1];
    *plVar12 = (long)psVar10;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    gutil::IOException::IOException(pIVar11,&local_168);
    __cxa_throw(pIVar11,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  local_190 = png_create_read_struct("1.6.37",0,0);
  if (local_190 == 0) {
    fclose(__stream);
    pIVar11 = (IOException *)__cxa_allocate_exception(0x28);
    local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_168,"Cannot allocate handle for reading PNG files","");
    gutil::IOException::IOException(pIVar11,&local_168);
    __cxa_throw(pIVar11,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  local_188 = png_create_info_struct(local_190);
  if (local_188 == 0) {
    png_destroy_read_struct(&local_190,0);
    fclose(__stream);
    pIVar11 = (IOException *)__cxa_allocate_exception(0x28);
    local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_168,"Cannot allocate PNG info structure","");
    gutil::IOException::IOException(pIVar11,&local_168);
    __cxa_throw(pIVar11,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  local_c0 = png_create_info_struct(local_190);
  if (local_c0 == 0) {
    png_destroy_read_struct(&local_190,&local_188,0);
    fclose(__stream);
    pIVar11 = (IOException *)__cxa_allocate_exception(0x28);
    local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_168,"Cannot allocate PNG info structure","");
    gutil::IOException::IOException(pIVar11,&local_168);
    __cxa_throw(pIVar11,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  local_17c = ds;
  __env = (__jmp_buf_tag *)png_set_longjmp_fn(local_190,longjmp,200);
  iVar6 = _setjmp(__env);
  if (iVar6 != 0) {
    png_destroy_read_struct(&local_190,&local_188,&local_c0);
    fclose(__stream);
    pIVar11 = (IOException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&local_b8,name,&local_169);
    std::operator+(&local_98,"Cannot read PNG file (",&local_b8);
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_98);
    local_168._M_dataplus._M_p = (pointer)*plVar12;
    psVar10 = (size_type *)(plVar12 + 2);
    if ((size_type *)local_168._M_dataplus._M_p == psVar10) {
      local_168.field_2._M_allocated_capacity = *psVar10;
      local_168.field_2._8_8_ = plVar12[3];
      local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
    }
    else {
      local_168.field_2._M_allocated_capacity = *psVar10;
    }
    local_168._M_string_length = plVar12[1];
    *plVar12 = (long)psVar10;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    gutil::IOException::IOException(pIVar11,&local_168);
    __cxa_throw(pIVar11,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  local_38 = __stream;
  png_init_io(local_190,__stream);
  png_read_info(local_190,local_188);
  uVar7 = png_get_image_width(local_190,local_188);
  uVar8 = png_get_image_height(local_190,local_188);
  bVar4 = png_get_color_type(local_190,local_188);
  local_104 = 1;
  if ((byte)(bVar4 - 2) < 5) {
    local_104 = *(uint *)(&DAT_00154030 + (ulong)(byte)(bVar4 - 2) * 4);
  }
  local_140 = (ulong)uVar8;
  if (w < 0) {
    w = (long)((ulong)uVar7 + (long)local_17c + -1) / (long)local_17c;
  }
  if (h < 0) {
    h = (long)(local_140 + (long)local_17c + -1) / (long)local_17c;
  }
  d = (ulong)local_104;
  local_178 = (ulong)uVar7;
  local_120 = h;
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::setSize(image,w,h,d);
  lVar18 = image->n;
  lVar13 = -lVar18;
  if (0 < lVar18) {
    lVar13 = lVar18;
  }
  memset(image->pixel,0,lVar13 * 2);
  if (bVar4 == 3) {
    png_set_palette_to_rgb(local_190);
  }
  bVar5 = png_get_bit_depth(local_190,local_188);
  local_48 = w;
  if (bVar5 < 8 && bVar4 == 0) {
    png_set_expand_gray_1_2_4_to_8(local_190);
  }
  else if ((bVar4 & 4) != 0) {
    png_set_strip_alpha(local_190);
  }
  iVar6 = png_get_rowbytes(local_190,local_188);
  uVar17 = local_140;
  uVar16 = 0xffffffffffffffff;
  if (-1 < (long)((long)iVar6 * local_140)) {
    uVar16 = (long)iVar6 * local_140;
  }
  local_c8 = operator_new__(uVar16);
  local_118 = operator_new__(uVar17 * 8);
  if (uVar17 != 0) {
    uVar16 = 0;
    pvVar14 = local_c8;
    do {
      *(void **)((long)local_118 + uVar16 * 8) = pvVar14;
      uVar16 = uVar16 + 1;
      pvVar14 = (void *)((long)pvVar14 + (long)iVar6);
    } while (uVar17 != uVar16);
  }
  png_read_image(local_190);
  uVar16 = local_48;
  if ((((local_17c < 2) && (local_130 == 0 && local_138 == 0)) && (local_48 == local_178)) &&
     (local_120 == uVar17)) {
    if ((int)uVar17 != 0) {
      pppuVar3 = image->img;
      uVar17 = 0;
      do {
        if ((int)local_178 != 0) {
          lVar18 = *(long *)((long)local_118 + uVar17 * 8);
          uVar19 = 0;
          uVar16 = uVar19;
          do {
            uVar23 = 0;
            uVar21 = uVar16;
            do {
              iVar6 = (int)uVar21;
              bVar4 = *(byte *)(lVar18 + iVar6);
              uVar15 = (ushort)bVar4;
              if (bVar5 < 0x10) {
                iVar22 = 1;
              }
              else {
                uVar15 = CONCAT11(bVar4,*(undefined1 *)(lVar18 + 1 + (long)iVar6));
                iVar22 = 2;
              }
              uVar16 = (ulong)(uint)(iVar6 + iVar22);
              pppuVar3[uVar23][uVar17][uVar19] = uVar15;
              uVar23 = uVar23 + 1;
              uVar21 = (ulong)(uint)(iVar6 + iVar22);
            } while (d != uVar23);
            uVar19 = uVar19 + 1;
          } while (uVar19 != local_178);
        }
        uVar17 = uVar17 + 1;
      } while (uVar17 != local_140);
    }
  }
  else {
    uVar17 = local_48 * d * 4;
    pvVar14 = operator_new(uVar17);
    local_e0 = pvVar14;
    if (uVar16 != 0) {
      memset(pvVar14,0,uVar17);
    }
    local_d8 = uVar17;
    pvVar9 = operator_new(uVar17);
    local_d0 = pvVar14;
    if (uVar16 != 0) {
      memset(pvVar9,0,local_d8);
    }
    uVar17 = 0;
    if (-local_130 != 0 && local_130 < 1) {
      uVar17 = -local_130;
    }
    local_f0 = pvVar9;
    if ((long)uVar17 < (long)local_120) {
      local_148 = (long)local_17c;
      uVar19 = local_148 * local_130;
      if (local_148 * local_130 < 1) {
        uVar19 = 0;
      }
      local_108 = 0;
      if (0 < local_138) {
        local_108 = (int)local_138;
      }
      local_108 = local_108 * local_104 * local_17c;
      local_128 = -local_138;
      if (-local_138 == 0 || 0 < local_138) {
        local_128 = 0;
      }
      local_50 = local_128 * d;
      local_58 = (void *)((long)pvVar9 + local_50 * 4);
      local_60 = d * 4;
      local_68 = (void *)((long)local_e0 + local_50 * 4);
      local_e8 = pvVar9;
      local_40 = image;
      do {
        __n = local_d8;
        local_70 = (local_130 + uVar17) * local_148;
        local_f8 = uVar17;
        if ((long)local_140 <= local_70) break;
        uVar7 = (uint)uVar19;
        if (uVar16 != 0) {
          local_110 = (uint)uVar19;
          memset(local_d0,0,local_d8);
          pvVar9 = local_e8;
          memset(local_f0,0,__n);
          uVar7 = local_110;
        }
        if (0 < local_17c) {
          lVar18 = (long)(int)uVar7;
          lVar13 = 0;
          do {
            local_78 = lVar13;
            local_100 = lVar18;
            pvVar14 = local_68;
            pvVar9 = local_58;
            uVar17 = local_128;
            iVar6 = local_108;
            if ((long)local_128 < (long)uVar16) {
              do {
                lVar18 = (local_138 + uVar17) * local_148;
                if ((long)local_178 <= lVar18) break;
                lVar13 = *(long *)((long)local_118 + local_100 * 8);
                lVar20 = 0;
                do {
                  uVar19 = 0;
                  do {
                    bVar4 = *(byte *)(lVar13 + iVar6);
                    uVar7 = (uint)bVar4;
                    if (bVar5 < 0x10) {
                      iVar22 = 1;
                    }
                    else {
                      uVar7 = (uint)CONCAT11(bVar4,*(undefined1 *)(lVar13 + 1 + (long)iVar6));
                      iVar22 = 2;
                    }
                    iVar6 = iVar6 + iVar22;
                    piVar1 = (int *)((long)pvVar14 + uVar19 * 4);
                    *piVar1 = *piVar1 + uVar7;
                    piVar1 = (int *)((long)pvVar9 + uVar19 * 4);
                    *piVar1 = *piVar1 + 1;
                    uVar19 = uVar19 + 1;
                  } while (d != uVar19);
                } while ((lVar20 + 1 < local_148) &&
                        (lVar2 = lVar18 + lVar20, lVar20 = lVar20 + 1, lVar2 + 1 < (long)local_178))
                ;
                uVar17 = uVar17 + 1;
                pvVar14 = (void *)((long)pvVar14 + local_60);
                pvVar9 = (void *)((long)pvVar9 + local_60);
              } while (uVar17 != uVar16);
            }
          } while ((local_78 + 1 < local_148) &&
                  (lVar18 = local_100 + 1, lVar13 = local_78 + 1,
                  local_78 + local_70 + 1 < (long)local_140));
          uVar7 = (uint)(local_100 + 1);
          image = local_40;
          pvVar9 = local_e8;
        }
        lVar18 = local_50;
        uVar17 = local_128;
        if ((long)local_128 < (long)uVar16) {
          do {
            if ((long)local_178 <= (long)((local_138 + uVar17) * local_148)) break;
            pppuVar3 = image->img;
            uVar19 = 0;
            do {
              uVar8 = *(uint *)((long)pvVar9 + uVar19 * 4 + lVar18 * 4);
              if (0 < (int)uVar8) {
                pppuVar3[uVar19][local_f8][uVar17] =
                     (ushort)((int)((uVar8 >> 1) +
                                   *(int *)((long)local_e0 + uVar19 * 4 + lVar18 * 4)) / (int)uVar8)
                     & 0xff;
              }
              uVar19 = uVar19 + 1;
            } while (d != uVar19);
            uVar17 = uVar17 + 1;
            lVar18 = lVar18 + uVar19;
          } while (uVar17 != uVar16);
        }
        uVar17 = local_f8 + 1;
        uVar19 = (ulong)uVar7;
        local_10c = uVar7;
      } while (uVar17 != local_120);
    }
    operator_delete(local_f0);
    operator_delete(local_d0);
  }
  operator_delete__(local_118);
  operator_delete__(local_c8);
  png_destroy_read_struct(&local_190,&local_188,&local_c0);
  fclose(local_38);
  return;
}

Assistant:

void PNGImageIO::load(ImageU16 &image, const char *name, int ds, long x, long y,
                      long w, long h) const
{
  if (!handlesFile(name, true))
  {
    throw gutil::IOException("Can only load PNG image ("+std::string(name)+")");
  }

  // initialize reading a png file

  FILE *in=fopen(name, "rb");

  if (in == 0)
  {
    throw gutil::IOException("Cannot open file ("+std::string(name)+")");
  }

  png_structp png=png_create_read_struct(PNG_LIBPNG_VER_STRING, 0, 0, 0);

  if (png == 0)
  {
    fclose(in);
    throw gutil::IOException("Cannot allocate handle for reading PNG files");
  }

  png_infop info=png_create_info_struct(png);

  if (info == 0)
  {
    png_destroy_read_struct(&png, static_cast<png_infopp>(0), static_cast<png_infopp>(0));
    fclose(in);
    throw gutil::IOException("Cannot allocate PNG info structure");
  }

  png_infop end=png_create_info_struct(png);

  if (end == 0)
  {
    png_destroy_read_struct(&png, &info, static_cast<png_infopp>(0));
    fclose(in);
    throw gutil::IOException("Cannot allocate PNG info structure");
  }

  unsigned char *img=0;
  unsigned char **row=0;

  if (setjmp(png_jmpbuf(png)))
  {
    delete [] img;
    delete [] row;

    png_destroy_read_struct(&png, &info, &end);
    fclose(in);
    throw gutil::IOException("Cannot read PNG file ("+std::string(name)+")");
  }

  // read header data

  png_init_io(png, in);
  png_read_info(png, info);

  long width=static_cast<long>(png_get_image_width(png, info));
  long height=static_cast<long>(png_get_image_height(png, info));

  int depth=1;
  int color=png_get_color_type(png, info);

  if (color == PNG_COLOR_TYPE_PALETTE || color == PNG_COLOR_TYPE_RGB ||
      color == PNG_COLOR_TYPE_RGB_ALPHA)
  {
    depth=3;
  }

  // adapt size of image

  if (w < 0)
  {
    w=(width+ds-1)/ds;
  }

  if (h < 0)
  {
    h=(height+ds-1)/ds;
  }

  image.setSize(w, h, depth);
  image.clear();

  // transform palette images to RGB

  if (color == PNG_COLOR_TYPE_PALETTE)
  {
    png_set_palette_to_rgb(png);
  }

  int bits=png_get_bit_depth(png, info);

  if (color == PNG_COLOR_TYPE_GRAY && bits < 8)
  {
    png_set_expand_gray_1_2_4_to_8(png);
  }

  // strip alpha channel if available

  if ((color & PNG_COLOR_MASK_ALPHA) != 0)
  {
    png_set_strip_alpha(png);
  }

  // read image completely

  int rn=static_cast<int>(png_get_rowbytes(png, info));
  img=new unsigned char [height*rn];
  row=new unsigned char * [height];

  for (int k=0; k<height; k++)
  {
    row[k]=img+k*rn;
  }

  png_read_image(png, static_cast<png_bytepp>(row));

  // load downscaled part?

  if (ds > 1 || x != 0 || y != 0 || w != width || h != height)
  {
    std::valarray<ImageU16::work_t> vline(0, w*depth);
    std::valarray<int> nline(0, w*depth);

    // skip the first y*ds image rows

    int rk=std::max(0l, y*ds);

    for (long k=std::max(0l, -y); k<h && (y+k)*ds<height; k++)
    {
      // load downscaled line

      vline=0;
      nline=0;

      for (long kk=0; kk<ds && kk+(y+k)*ds<height; kk++)
      {
        int  jj=std::max(0l, x)*ds*depth;
        long j=std::max(0l, -x)*depth;

        for (long i=std::max(0l, -x); i<w && (x+i)*ds<width; i++)
        {
          for (int ii=0; ii<ds && (x+i)*ds+ii<width; ii++)
          {
            for (int d=0; d<depth; d++)
            {
              ImageU16::store_t v;

              if (bits < 16)
              {
                v=static_cast<ImageU16::store_t>(row[rk][jj]);
                jj++;
              }
              else
              {
                v=static_cast<ImageU16::store_t>(row[rk][jj]<<8) | row[rk][jj+1];
                jj+=2;
              }

              if (image.isValidS(v))
              {
                vline[j+d]+=v;
                nline[j+d]++;
              }
            }
          }

          j+=depth;
        }

        rk++;
      }

      // store line into image

      long j=std::max(0l, -x)*depth;

      for (long i=std::max(0l, -x); i<w && (x+i)*ds<width; i++)
      {
        for (int d=0; d<depth; d++)
        {
          if (nline[j] > 0)
          {
            image.set(i, k, d, static_cast<ImageU8::store_t>((vline[j]+nline[j]/2)/nline[j]));
          }

          j++;
        }
      }
    }
  }
  else // load whole image
  {
    for (long k=0; k<height; k++)
    {
      int j=0;

      for (long i=0; i<width; i++)
      {
        for (int d=0; d<depth; d++)
        {
          ImageU16::store_t v;

          if (bits < 16)
          {
            v=static_cast<ImageU16::store_t>(row[k][j]);
            j++;
          }
          else
          {
            v=static_cast<ImageU16::store_t>(row[k][j]<<8) | row[k][j+1];
            j+=2;
          }

          image.set(i, k, d, v);
        }
      }
    }
  }

  // close data set

  delete [] row;
  delete [] img;

  png_destroy_read_struct(&png, &info, &end);
  fclose(in);
}